

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void __thiscall result_tests::check_value_or::test_method(check_value_or *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffff7d8;
  lazy_ostream *in_stack_fffffffffffff7e0;
  char *in_stack_fffffffffffff7e8;
  Result<result_tests::NoCopy> *in_stack_fffffffffffff7f0;
  bilingual_str *in_stack_fffffffffffff7f8;
  const_string *in_stack_fffffffffffff800;
  undefined1 *in_stack_fffffffffffff808;
  string *in_stack_fffffffffffff810;
  allocator<char> *in_stack_fffffffffffff818;
  allocator<char> *__a;
  char *in_stack_fffffffffffff820;
  char *__s;
  bilingual_str *in_stack_fffffffffffff828;
  bilingual_str *s;
  undefined1 local_6a3 [2];
  string local_6a1;
  undefined1 local_670 [38];
  allocator<char> local_64a;
  allocator<char> local_649;
  undefined1 local_648 [16];
  undefined1 local_638 [64];
  lazy_ostream local_5f8;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [64];
  lazy_ostream local_598;
  undefined1 local_588 [16];
  undefined1 local_578 [68];
  lazy_ostream local_534;
  undefined1 local_518 [68];
  lazy_ostream local_4d4;
  undefined1 local_4b8 [96];
  lazy_ostream local_458 [20];
  undefined1 local_310 [96];
  lazy_ostream local_2b0 [20];
  undefined1 local_168 [352];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff818,
               (const_string *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    IntFn((int)((ulong)in_stack_fffffffffffff818 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff808 >> 0x38,0));
    local_4d4._vptr_lazy_ostream._4_4_ = 0x14;
    local_4d4._8_4_ =
         util::Result<int>::value_or<int>
                   ((Result<int> *)in_stack_fffffffffffff7e8,(int *)in_stack_fffffffffffff7e0);
    local_4d4._vptr_lazy_ostream._0_4_ = 10;
    in_stack_fffffffffffff7e8 = "10";
    in_stack_fffffffffffff7e0 = &local_4d4;
    in_stack_fffffffffffff7d8 = "IntFn(10, true).value_or(20)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_4b8,&local_4d4.field_0xc,0x58,1,2,&local_4d4.m_empty);
    util::Result<int>::~Result((Result<int> *)in_stack_fffffffffffff7d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff818,
               (const_string *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    IntFn((int)((ulong)in_stack_fffffffffffff818 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffff808 >> 0x38,0));
    local_534._vptr_lazy_ostream._4_4_ = 0x14;
    local_534._8_4_ =
         util::Result<int>::value_or<int>
                   ((Result<int> *)in_stack_fffffffffffff7e8,(int *)in_stack_fffffffffffff7e0);
    local_534._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_fffffffffffff7e8 = "20";
    in_stack_fffffffffffff7e0 = &local_534;
    in_stack_fffffffffffff7d8 = "IntFn(10, false).value_or(20)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_518,&local_534.field_0xc,0x59,1,2,&local_534.m_empty);
    util::Result<int>::~Result((Result<int> *)in_stack_fffffffffffff7d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff818,
               (const_string *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    NoCopyFn((int)((ulong)in_stack_fffffffffffff828 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff810 >> 0x38,0));
    local_598._vptr_lazy_ostream._4_4_ = 0x14;
    util::Result<result_tests::NoCopy>::value_or<int>
              (in_stack_fffffffffffff7f0,(int *)in_stack_fffffffffffff7e8);
    local_598._vptr_lazy_ostream._0_4_ = 10;
    in_stack_fffffffffffff7e8 = "10";
    in_stack_fffffffffffff7e0 = &local_598;
    in_stack_fffffffffffff7d8 = "NoCopyFn(10, true).value_or(20)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy,int>
              (local_578,local_588,0x5a,1,2,&local_598.m_empty);
    NoCopy::~NoCopy((NoCopy *)in_stack_fffffffffffff7d8);
    util::Result<result_tests::NoCopy>::~Result
              ((Result<result_tests::NoCopy> *)in_stack_fffffffffffff7d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff818,
               (const_string *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    NoCopyFn((int)((ulong)in_stack_fffffffffffff828 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff810 >> 0x38,0));
    local_5f8._vptr_lazy_ostream._4_4_ = 0x14;
    util::Result<result_tests::NoCopy>::value_or<int>
              (in_stack_fffffffffffff7f0,(int *)in_stack_fffffffffffff7e8);
    local_5f8._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_fffffffffffff7e8 = "20";
    in_stack_fffffffffffff7e0 = &local_5f8;
    in_stack_fffffffffffff7d8 = "NoCopyFn(10, false).value_or(20)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,result_tests::NoCopy,int>
              (local_5d8,local_5e8,0x5b,1,2,&local_5f8.m_empty);
    NoCopy::~NoCopy((NoCopy *)in_stack_fffffffffffff7d8);
    util::Result<result_tests::NoCopy>::~Result
              ((Result<result_tests::NoCopy> *)in_stack_fffffffffffff7d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff818,
               (const_string *)in_stack_fffffffffffff810,(size_t)in_stack_fffffffffffff808,
               in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff828->original,in_stack_fffffffffffff820,
               in_stack_fffffffffffff818);
    Untranslated(in_stack_fffffffffffff810);
    StrFn(in_stack_fffffffffffff828,SUB81((ulong)in_stack_fffffffffffff820 >> 0x38,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff828->original,in_stack_fffffffffffff820,
               in_stack_fffffffffffff818);
    Untranslated(in_stack_fffffffffffff810);
    util::Result<bilingual_str>::value_or<bilingual_str>
              ((Result<bilingual_str> *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff828->original,in_stack_fffffffffffff820,
               in_stack_fffffffffffff818);
    Untranslated(in_stack_fffffffffffff810);
    in_stack_fffffffffffff7e8 = "Untranslated(\"A\")";
    in_stack_fffffffffffff7e0 = local_2b0;
    in_stack_fffffffffffff7d8 = "StrFn(Untranslated(\"A\"), true).value_or(Untranslated(\"B\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
              (local_638,local_648,0x5c,1,2,local_168);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator((allocator<char> *)(local_670 + 0x25));
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator(&local_64a);
    util::Result<bilingual_str>::~Result((Result<bilingual_str> *)in_stack_fffffffffffff7d8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator(&local_649);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __s = local_670 + 0x10;
    __a = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    s = (bilingual_str *)local_670;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7d8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)__a,(const_string *)in_stack_fffffffffffff810,
               (size_t)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff7e0,(char (*) [1])in_stack_fffffffffffff7d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff7e8,
               (pointer)in_stack_fffffffffffff7e0,(unsigned_long)in_stack_fffffffffffff7d8);
    in_stack_fffffffffffff810 = &local_6a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(&s->original,__s,__a);
    Untranslated(in_stack_fffffffffffff810);
    StrFn(s,SUB81((ulong)__s >> 0x38,0));
    in_stack_fffffffffffff808 = local_6a3 + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(&s->original,__s,__a);
    Untranslated(in_stack_fffffffffffff810);
    util::Result<bilingual_str>::value_or<bilingual_str>
              ((Result<bilingual_str> *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    in_stack_fffffffffffff800 = (const_string *)local_6a3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(&s->original,__s,__a);
    Untranslated(in_stack_fffffffffffff810);
    in_stack_fffffffffffff7e8 = "Untranslated(\"B\")";
    in_stack_fffffffffffff7e0 = local_458;
    in_stack_fffffffffffff7d8 = "StrFn(Untranslated(\"A\"), false).value_or(Untranslated(\"B\"))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bilingual_str,bilingual_str>
              ((undefined1 *)((long)&local_6a1.field_2 + 1),
               (undefined1 *)((long)&local_6a1._M_dataplus._M_p + 1),0x5d,1,2,local_310);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator((allocator<char> *)local_6a3);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator((allocator<char> *)(local_6a3 + 1));
    util::Result<bilingual_str>::~Result((Result<bilingual_str> *)in_stack_fffffffffffff7d8);
    bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff7d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff7d8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_value_or)
{
    BOOST_CHECK_EQUAL(IntFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(IntFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(NoCopyFn(10, true).value_or(20), 10);
    BOOST_CHECK_EQUAL(NoCopyFn(10, false).value_or(20), 20);
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), true).value_or(Untranslated("B")), Untranslated("A"));
    BOOST_CHECK_EQUAL(StrFn(Untranslated("A"), false).value_or(Untranslated("B")), Untranslated("B"));
}